

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLCellLinOp::applyMetricTerm(MLCellLinOp *this,int amrlev,int mglev,Any *rhs)

{
  Any *rhs_local;
  int mglev_local;
  int amrlev_local;
  MLCellLinOp *this_local;
  
  return;
}

Assistant:

void
MLCellLinOp::applyMetricTerm (int amrlev, int mglev, Any& rhs) const
{
    amrex::ignore_unused(amrlev,mglev,rhs);
#if (AMREX_SPACEDIM != 3)

    if (!m_has_metric_term) return;

    AMREX_ASSERT(rhs.is<MultiFab>());
    applyMetricTermToMF(amrlev, mglev, rhs.get<MultiFab>());
#endif
}